

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O0

void __thiscall CETime::CETime(CETime *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CETime_00151d28;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x14378a);
  init_members(this);
  return;
}

Assistant:

CETime::CETime()
{
    init_members();
}